

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_detail.h
# Opt level: O0

type * __thiscall
lf::io::
numNodesAdapted<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<2>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>>
          (type *__return_storage_ptr__,io *this,
          actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
          *a0)

{
  type *ptVar1;
  undefined1 local_11 [9];
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_local;
  
  local_11._1_8_ = __return_storage_ptr__;
  ptVar1 = boost::phoenix::
           expr_ext<boost::phoenix::actor,_boost::phoenix::detail::tag::function_eval,_lf::io::detail1::numNodesAdapted_impl_1,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_>
           ::make((type *)local_11,(numNodesAdapted_impl_1 *)__return_storage_ptr__,a0);
  return ptVar1;
}

Assistant:

BOOST_PHOENIX_ADAPT_FUNCTION(int, numNodesAdapted, NumNodes, 1);
}  // namespace lf::io

/// \cond
namespace boost::spirit::traits {

template <class Enum, class RawValue>
struct assign_to_attribute_from_value<
    Enum, RawValue,
    typename std::enable_if_t<std::is_enum_v<Enum> &&
                              !std::is_same_v<Enum, RawValue>>> {
  static void call(RawValue const& raw, Enum& cat) {
    if constexpr (detail::has_value_type<RawValue>::value) {  // NOLINT
      // specialization for endian::endian
      const typename RawValue::value_type value = raw;
      cat = static_cast<Enum>(value);
    } else {  // NOLINT
      cat = static_cast<Enum>(raw);
    }
  }
};

}